

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generators.cpp
# Opt level: O0

void __thiscall flatbuffers::CodeWriter::operator+=(CodeWriter *this,string *text)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  pointer ppVar5;
  char *pcVar6;
  ostream *this_00;
  string local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  string *value;
  _Self local_50;
  iterator iter;
  string key;
  size_type end;
  size_type begin;
  string *text_local;
  CodeWriter *this_local;
  
  if (((this->ignore_ident_ & 1U) == 0) && (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)
     ) {
    AppendIdent(this,&this->stream_);
  }
  while (((uVar2 = std::__cxx11::string::find((char *)text,0x42b7ed), uVar2 != 0xffffffffffffffff &&
          (uVar3 = std::__cxx11::string::find((char *)text,0x42b068), uVar3 != 0xffffffffffffffff))
         && (uVar2 <= uVar3))) {
    lVar4 = std::__cxx11::string::c_str();
    std::ostream::write(&this->field_0x40,lVar4);
    std::__cxx11::string::substr((ulong)&iter,(ulong)text);
    local_50._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find(&this->value_map_,(key_type *)&iter);
    value = (string *)
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::end(&this->value_map_);
    bVar1 = std::operator!=(&local_50,(_Self *)&value);
    if (!bVar1) {
      __assert_fail("false && \"could not find key\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/code_generators.cpp"
                    ,0x58,"void flatbuffers::CodeWriter::operator+=(std::string)");
    }
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_50);
    local_70 = &ppVar5->second;
    std::operator<<((ostream *)&this->field_0x40,(string *)local_70);
    std::__cxx11::string::substr((ulong)local_90,(ulong)text);
    std::__cxx11::string::operator=((string *)text,local_90);
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::~string((string *)&iter);
  }
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) == 0) && (pcVar6 = (char *)std::__cxx11::string::back(), *pcVar6 == '\\')) {
    std::__cxx11::string::pop_back();
    this->ignore_ident_ = true;
    std::operator<<((ostream *)&this->field_0x40,(string *)text);
  }
  else {
    this->ignore_ident_ = false;
    this_00 = std::operator<<((ostream *)&this->field_0x40,(string *)text);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void CodeWriter::operator+=(std::string text) {
  if (!ignore_ident_ && !text.empty()) AppendIdent(stream_);

  while (true) {
    auto begin = text.find("{{");
    if (begin == std::string::npos) { break; }

    auto end = text.find("}}");
    if (end == std::string::npos || end < begin) { break; }

    // Write all the text before the first {{ into the stream.
    stream_.write(text.c_str(), begin);

    // The key is between the {{ and }}.
    const std::string key = text.substr(begin + 2, end - begin - 2);

    // Find the value associated with the key.  If it exists, write the
    // value into the stream, otherwise write the key itself into the stream.
    auto iter = value_map_.find(key);
    if (iter != value_map_.end()) {
      const std::string &value = iter->second;
      stream_ << value;
    } else {
      FLATBUFFERS_ASSERT(false && "could not find key");
      stream_ << key;
    }

    // Update the text to everything after the }}.
    text = text.substr(end + 2);
  }
  if (!text.empty() && text.back() == '\\') {
    text.pop_back();
    ignore_ident_ = true;
    stream_ << text;
  } else {
    ignore_ident_ = false;
    stream_ << text << std::endl;
  }
}